

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-parse.c
# Opt level: O2

int fy_fetch_block_entry(fy_parser *fyp,int c)

{
  undefined8 uVar1;
  int iVar2;
  fy_atom *pfVar3;
  fy_atom *pfVar4;
  fy_simple_key *pfVar5;
  fy_atom *pfVar6;
  fy_token *pfVar7;
  char *pcVar8;
  uint uVar9;
  fy_atom local_88;
  undefined8 uStack_50;
  fy_diag_report_ctx local_48;
  
  pfVar3 = (fy_atom *)&local_48;
  if (c == 0x2d) {
    if (fyp->flow_level == 0) {
      if ((fyp->field_0x70 & 8) != 0) {
        pfVar3 = (fy_atom *)&local_48;
        if (fyp->indent < fyp->column) {
          uStack_50 = 0x12c0bf;
          iVar2 = fy_push_indent(fyp,fyp->column,false);
          if (iVar2 != 0) {
            pcVar8 = "fy_push_indent() failed";
            uStack_50 = 4;
            uVar9 = 4;
            iVar2 = 0x748;
            pfVar3 = (fy_atom *)&local_48;
            goto LAB_0012c035;
          }
          pfVar4 = &local_88;
          pfVar3 = fy_fill_atom(fyp,0,pfVar4);
          pfVar7 = fy_token_queue_internal(fyp,&fyp->queued_tokens,FYTT_BLOCK_SEQUENCE_START,pfVar3)
          ;
          pfVar3 = pfVar4;
          if (pfVar7 == (fy_token *)0x0) {
            pcVar8 = "fy_token_queue_internal() failed";
            uVar9 = 4;
            iVar2 = 0x74d;
            goto LAB_0012c3e4;
          }
        }
        goto LAB_0012c1c8;
      }
      if (fyp->state == FYPS_BLOCK_MAPPING_VALUE) {
        local_48.override_line = 0;
        local_48.override_column = 0;
        local_48.has_override = false;
        local_48._17_7_ = 0;
        local_48.override_file = (char *)0x0;
        local_48.type = FYET_ERROR;
        local_48.module = FYEM_SCAN;
        pfVar3 = &local_88;
        pfVar4 = fy_fill_atom_at(fyp,0,1,pfVar3);
        local_48.fyt = fy_token_create(FYTT_INPUT_MARKER,pfVar4);
        pcVar8 = "block sequence on the same line as a mapping key";
      }
      else if (fyp->state - FYPS_BLOCK_SEQUENCE_FIRST_ENTRY < 2) {
        local_48.override_line = 0;
        local_48.override_column = 0;
        local_48.has_override = false;
        local_48._17_7_ = 0;
        local_48.override_file = (char *)0x0;
        local_48.type = FYET_ERROR;
        local_48.module = FYEM_SCAN;
        pfVar3 = &local_88;
        pfVar4 = fy_fill_atom_at(fyp,0,1,pfVar3);
        local_48.fyt = fy_token_create(FYTT_INPUT_MARKER,pfVar4);
        pcVar8 = "block sequence on the same line as a previous item";
      }
      else {
        local_48.override_line = 0;
        local_48.override_column = 0;
        local_48.has_override = false;
        local_48._17_7_ = 0;
        local_48.override_file = (char *)0x0;
        local_48.type = FYET_ERROR;
        local_48.module = FYEM_SCAN;
        pfVar3 = &local_88;
        pfVar4 = fy_fill_atom_at(fyp,0,1,pfVar3);
        local_48.fyt = fy_token_create(FYTT_INPUT_MARKER,pfVar4);
        pcVar8 = "block sequence entries not allowed in this context";
      }
    }
    else {
      pfVar3 = (fy_atom *)&local_48;
      if (fyp->indent < fyp->column + 2) {
LAB_0012c1c8:
        *(undefined8 *)&pfVar3[-1].increment = 0x12c1d0;
        pfVar5 = fy_would_remove_required_simple_key(fyp);
        if (pfVar5 == (fy_simple_key *)0x0) {
          *(undefined8 *)&pfVar3[-1].increment = 0xe;
          uVar1 = *(undefined8 *)&pfVar3[-1].increment;
          *(undefined8 *)&pfVar3[-1].increment = 0x12c259;
          iVar2 = fy_remove_simple_key(fyp,(fy_token_type)uVar1);
          if (iVar2 == 0) {
            fyp->field_0x70 = fyp->field_0x70 | 8;
            pfVar3[-1].fyi = (fy_input *)0x20;
            uVar1 = pfVar3[-1].fyi;
            pfVar3[-1].fyi = (fy_input *)"true";
            pfVar3[-1].storage_hint = 0x12c350;
            fy_parser_diag(fyp,(uint)uVar1,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                           ,0x76c,"fy_fetch_block_entry","simple_key_allowed -> %s\n");
            pfVar4 = (fy_atom *)&pfVar3[-2].increment;
            pfVar3[-2].fyi = (fy_input *)0x1;
            uVar1 = pfVar3[-2].fyi;
            pfVar3[-2].fyi = (fy_input *)0x12c365;
            pfVar6 = fy_fill_atom(fyp,(int)uVar1,pfVar4);
            pfVar3[-2].fyi = (fy_input *)0xe;
            uVar1 = pfVar3[-2].fyi;
            pfVar3[-2].fyi = (fy_input *)0x12c375;
            pfVar7 = fy_token_queue(fyp,(fy_token_type)uVar1,pfVar6);
            if (pfVar7 != (fy_token *)0x0) {
              pfVar3[-2].fyi = (fy_input *)0x12c382;
              iVar2 = fy_parse_peek(fyp);
              if ((iVar2 != 0x20) && (iVar2 != 9)) {
                return 0;
              }
              pfVar3[-2].fyi = (fy_input *)0x12c39a;
              fy_advance(fyp,iVar2);
              return 0;
            }
            pcVar8 = "fy_token_queue() failed";
            pfVar3[-2].fyi = (fy_input *)0x4;
            uVar9 = (uint)pfVar3[-2].fyi;
            iVar2 = 0x770;
LAB_0012c3e4:
            *(undefined8 *)&pfVar4[-1].increment = 0x12c3eb;
            fy_parser_diag(fyp,uVar9,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                           ,iVar2,"fy_fetch_block_entry",pcVar8);
            return 0;
          }
          pcVar8 = "fy_remove_simple_key() failed";
          *(undefined8 *)&pfVar3[-1].increment = 4;
          uVar9 = (uint)*(undefined8 *)&pfVar3[-1].increment;
          iVar2 = 0x769;
          goto LAB_0012c035;
        }
        pfVar7 = pfVar5->token;
        if (pfVar7 == (fy_token *)0x0) {
          local_48.override_line = 0;
          local_48.override_column = 0;
          local_48.has_override = false;
          local_48._17_7_ = 0;
          local_48.override_file = (char *)0x0;
          local_48.type = FYET_ERROR;
          local_48.module = FYEM_SCAN;
          pfVar4 = (fy_atom *)&pfVar3[-2].increment;
          pfVar3[-2].fyi = (fy_input *)0x1;
          uVar1 = pfVar3[-2].fyi;
          pfVar3[-2].fyi = (fy_input *)0x12c2b9;
          pfVar6 = fy_fill_atom_at(fyp,0,(int)uVar1,pfVar4);
          pfVar3[-2].fyi = (fy_input *)0x16;
          uVar1 = pfVar3[-2].fyi;
          pfVar3[-2].fyi = (fy_input *)0x12c2c6;
          local_48.fyt = fy_token_create((fy_token_type)uVar1,pfVar6);
        }
        else {
          if (pfVar7->type - FYTT_ANCHOR < 2) {
            local_48.override_line = 0;
            local_48.override_column = 0;
            local_48.has_override = false;
            local_48._17_7_ = 0;
            local_48.override_file = (char *)0x0;
            local_48.type = FYET_ERROR;
            local_48.module = FYEM_SCAN;
            *(undefined8 *)&pfVar3[-1].increment = 0x12c217;
            local_48.fyt = fy_token_ref(pfVar7);
            pcVar8 = "tag";
            if (pfVar5->token->type == FYTT_ANCHOR) {
              pcVar8 = "anchor";
            }
            *(undefined8 *)&pfVar3[-1].increment = 0x12c249;
            fy_parser_diag_report(fyp,&local_48,"invalid %s indent for sequence",pcVar8);
            goto LAB_0012c303;
          }
          local_48.override_line = 0;
          local_48.override_column = 0;
          local_48.has_override = false;
          local_48._17_7_ = 0;
          local_48.override_file = (char *)0x0;
          local_48.type = FYET_ERROR;
          local_48.module = FYEM_SCAN;
          *(undefined8 *)&pfVar3[-1].increment = 0x12c2eb;
          local_48.fyt = fy_token_ref(pfVar7);
          pfVar4 = pfVar3;
        }
        pcVar8 = "missing \':\'";
        pfVar3 = pfVar4;
      }
      else {
        local_48.override_line = 0;
        local_48.override_column = 0;
        local_48.has_override = false;
        local_48._17_7_ = 0;
        local_48.override_file = (char *)0x0;
        local_48.type = FYET_ERROR;
        local_48.module = FYEM_SCAN;
        pfVar3 = fy_fill_atom_at(fyp,0,1,&local_88);
        local_48.fyt = fy_token_create(FYTT_INPUT_MARKER,pfVar3);
        pcVar8 = "wrongly indented block sequence in flow mode";
        pfVar3 = &local_88;
      }
    }
    *(undefined8 *)&pfVar3[-1].increment = 0x12c303;
    fy_parser_diag_report(fyp,&local_48,pcVar8);
  }
  else {
    pcVar8 = "illegal block entry";
    uStack_50 = 4;
    uVar9 = 4;
    iVar2 = 0x72c;
LAB_0012c035:
    *(undefined8 *)((long)pfVar3 + -8) = 0x12c03c;
    fy_parser_diag(fyp,uVar9,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                   ,iVar2,"fy_fetch_block_entry",pcVar8);
  }
LAB_0012c303:
  *(undefined8 *)((long)pfVar3 + -8) = 0xffffffffffffffff;
  return (int)*(undefined8 *)((long)pfVar3 + -8);
}

Assistant:

int fy_fetch_block_entry(struct fy_parser *fyp, int c) {
    int rc;
    struct fy_mark mark;
    struct fy_simple_key *fysk;
    struct fy_token *fyt;

    fyp_error_check(fyp, c == '-', err_out,
                    "illegal block entry");

    FYP_PARSE_ERROR_CHECK(fyp, 0, 1, FYEM_SCAN,
                          !fyp->flow_level || (fyp->column + 2) > fyp->indent, err_out,
                          "wrongly indented block sequence in flow mode");

    if (!(fyp->flow_level || fyp->simple_key_allowed)) {
        if (!fyp->simple_key_allowed && fyp->state == FYPS_BLOCK_MAPPING_VALUE)
            FYP_PARSE_ERROR(fyp, 0, 1, FYEM_SCAN,
                            "block sequence on the same line as a mapping key");
        else if (fyp->state == FYPS_BLOCK_SEQUENCE_FIRST_ENTRY ||
                 fyp->state == FYPS_BLOCK_SEQUENCE_ENTRY)
            FYP_PARSE_ERROR(fyp, 0, 1, FYEM_SCAN,
                            "block sequence on the same line as a previous item");
        else
            FYP_PARSE_ERROR(fyp, 0, 1, FYEM_SCAN,
                            "block sequence entries not allowed in this context");
        goto err_out;
    }

    /* we have to save the start mark */
    fy_get_mark(fyp, &mark);

    if (!fyp->flow_level && fyp->indent < fyp->column) {

        /* push the new indent level */
        rc = fy_push_indent(fyp, fyp->column, false);
        fyp_error_check(fyp, !rc, err_out_rc,
                        "fy_push_indent() failed");

        fyt = fy_token_queue_internal(fyp, &fyp->queued_tokens,
                                      FYTT_BLOCK_SEQUENCE_START, fy_fill_atom_a(fyp, 0));
        fyp_error_check(fyp, fyt, err_out_rc,
                        "fy_token_queue_internal() failed");
    }

    if (c == '-' && fyp->flow_level) {
        /* this is an error, but we let the parser catch it */
        ;
    }

    fysk = fy_would_remove_required_simple_key(fyp);

    if (fysk) {
        if (fysk->token) {
            if (fysk->token->type == FYTT_ANCHOR || fysk->token->type == FYTT_TAG)
                FYP_TOKEN_ERROR(fyp, fysk->token, FYEM_SCAN,
                                "invalid %s indent for sequence",
                                fysk->token->type == FYTT_ANCHOR ?
                                "anchor" : "tag");
            else
                FYP_TOKEN_ERROR(fyp, fysk->token, FYEM_SCAN,
                                "missing ':'");
        } else
            FYP_PARSE_ERROR(fyp, 0, 1, FYEM_SCAN,
                            "missing ':'");
        goto err_out;
    }

    rc = fy_remove_simple_key(fyp, FYTT_BLOCK_ENTRY);
    fyp_error_check(fyp, !rc, err_out_rc,
                    "fy_remove_simple_key() failed");

    fyp->simple_key_allowed = true;
    fyp_scan_debug(fyp, "simple_key_allowed -> %s\n", fyp->simple_key_allowed ? "true" : "false");

    fyt = fy_token_queue(fyp, FYTT_BLOCK_ENTRY, fy_fill_atom_a(fyp, 1));
    fyp_error_check(fyp, fyt, err_out_rc,
                    "fy_token_queue() failed");

    /* special case for allowing whitespace (including tabs) after - */
    if (fy_is_ws(c = fy_parse_peek(fyp)))
        fy_advance(fyp, c);

    return 0;

    err_out:
    rc = -1;
    err_out_rc:
    return rc;
}